

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_idle_ref(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  uv_idle_t h;
  undefined1 local_80 [120];
  
  uVar2 = uv_default_loop();
  uv_idle_init(uVar2,local_80);
  uv_idle_start(local_80,fail_cb2);
  uv_unref(local_80);
  uVar2 = uv_default_loop();
  uv_run(uVar2,0);
  do_close(local_80);
  uVar2 = uv_default_loop();
  uv_walk(uVar2,close_walk_cb,0);
  uv_run(uVar2,0);
  uVar2 = uv_default_loop();
  iVar1 = uv_loop_close(uVar2);
  if (iVar1 == 0) {
    return 0;
  }
  run_test_idle_ref_cold_1();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ref.c"
          ,0x3e,"0 && \"fail_cb2 should not have been called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(idle_ref) {
  uv_idle_t h;
  uv_idle_init(uv_default_loop(), &h);
  uv_idle_start(&h, (uv_idle_cb) fail_cb2);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY();
  return 0;
}